

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPConnection.cpp
# Opt level: O0

void __thiscall TCPConnection::Tick(TCPConnection *this)

{
  int iVar1;
  uint32_t uVar2;
  uint uVar3;
  uint64_t uVar4;
  DataBuffer *buffer_00;
  uint32_t timeoutTime_us;
  uint32_t currentTime_us;
  DataBuffer *buffer;
  int i;
  int count;
  TCPConnection *this_local;
  
  osMutex::Take(&this->HoldingQueueLock,
                "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/TCPConnection.cpp"
                ,0x165);
  iVar1 = osQueue::GetCount(&this->HoldingQueue);
  uVar4 = osTime::GetTime();
  uVar2 = (uint32_t)uVar4;
  uVar3 = uVar2 - 100000;
  for (buffer._0_4_ = 0; (int)buffer < iVar1; buffer._0_4_ = (int)buffer + 1) {
    buffer_00 = (DataBuffer *)osQueue::Get(&this->HoldingQueue);
    if ((int)(buffer_00->Time_us - uVar3) < 1) {
      printf("TCP retransmit timeout %u, %u, delta %d\n",(ulong)buffer_00->Time_us,(ulong)uVar3,
             (ulong)(buffer_00->Time_us - uVar3));
      buffer_00->Time_us = uVar2;
      ProtocolIPv4::Retransmit(this->IP,buffer_00);
    }
    osQueue::Put(&this->HoldingQueue,buffer_00);
  }
  osMutex::Give(&this->HoldingQueueLock);
  for (buffer._0_4_ = 0; (int)buffer < 5; buffer._0_4_ = (int)buffer + 1) {
    if ((*(int *)(&this->TCP->field_0x0 + (long)(int)buffer * 0x370) == 10) &&
       (999999 < uVar2 - *(int *)(&this->TCP->field_0x24 + (long)(int)buffer * 0x370))) {
      *(undefined4 *)(&this->TCP->field_0x0 + (long)(int)buffer * 0x370) = 0;
    }
  }
  if (this->LastAck != this->AcknowledgementNumber) {
    SendFlags(this,'\x10');
  }
  return;
}

Assistant:

void TCPConnection::Tick()
{
    int count;
    int i;
    DataBuffer* buffer;
    uint32_t currentTime_us;
    uint32_t timeoutTime_us;

    HoldingQueueLock.Take(__FILE__, __LINE__);
    count = HoldingQueue.GetCount();
    currentTime_us = (int32_t)osTime::GetTime();

    // Check for retransmit timeout
    timeoutTime_us = currentTime_us - TCP_RETRANSMIT_TIMEOUT_US;
    for (i = 0; i < count; i++)
    {
        buffer = (DataBuffer*)HoldingQueue.Get();
        if ((int32_t)(buffer->Time_us - timeoutTime_us) <= 0)
        {
            printf("TCP retransmit timeout %u, %u, delta %d\n",
                   buffer->Time_us,
                   timeoutTime_us,
                   (int32_t)(buffer->Time_us - timeoutTime_us));
            buffer->Time_us = currentTime_us;
            IP->Retransmit(buffer);
        }

        HoldingQueue.Put(buffer);
    }
    HoldingQueueLock.Give();

    // Check for TIMED_WAIT timeouts
    for (i = 0; i < TCP_MAX_CONNECTIONS; i++)
    {
        if (TCP->ConnectionList[i].State == TIMED_WAIT)
        {
            if (currentTime_us - TCP->ConnectionList[i].Time_us >= TCP_TIMED_WAIT_TIMEOUT_US)
            {
                TCP->ConnectionList[i].State = CLOSED;
            }
        }
    }

    // Check for delayed ACK
    if (LastAck != AcknowledgementNumber)
    {
        SendFlags(FLAG_ACK);
    }
}